

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

LPWSTR UTIL_MBToWC_Alloc(LPCSTR lpMultiByteStr,int cbMultiByte)

{
  FILE *__stream;
  uint cchWideChar;
  int iVar1;
  DWORD DVar2;
  LPWSTR lpWideCharStr;
  int *piVar3;
  
  cchWideChar = MultiByteToWideChar(0,0,lpMultiByteStr,cbMultiByte,(LPWSTR)0x0,0);
  if (cchWideChar == 0) {
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d4c23;
    GetLastError();
  }
  else {
    if (cchWideChar < 0x3fffffff) {
      lpWideCharStr = (LPWSTR)PAL_malloc((ulong)(cchWideChar * 2));
      if (lpWideCharStr != (LPWSTR)0x0) {
        iVar1 = MultiByteToWideChar(0,0,lpMultiByteStr,cbMultiByte,lpWideCharStr,cchWideChar);
        if (iVar1 < 1) {
          fprintf(_stderr,"] %s %s:%d","UTIL_MBToWC_Alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/misc/utils.cpp"
                  ,0x105);
          __stream = _stderr;
          DVar2 = GetLastError();
          fprintf(__stream,"MCToMB error; GetLastError returns %#x\n",(ulong)DVar2);
          PAL_free(lpWideCharStr);
          return (LPWSTR)0x0;
        }
        return lpWideCharStr;
      }
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001d4c23;
      piVar3 = __errno_location();
      strerror(*piVar3);
      DVar2 = FILEGetLastErrorFromErrno();
    }
    else {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_001d4c23:
        abort();
      }
      DVar2 = 0x216;
    }
    SetLastError(DVar2);
  }
  return (LPWSTR)0x0;
}

Assistant:

LPWSTR UTIL_MBToWC_Alloc(LPCSTR lpMultiByteStr, int cbMultiByte)
{
    int length;
    LPWSTR lpWideCharStr;

    /* get required buffer length */
    length = MultiByteToWideChar(CP_ACP, 0, lpMultiByteStr, cbMultiByte,
                                      NULL, 0);
    if(0 == length)
    {
        ERROR("MBToWC error; GetLastError returns %#x", GetLastError());
        return NULL;
    }

    if (length >= (INT_MAX / sizeof(WCHAR)))
    {
        ERROR("integer overflow! length = %d , sizeof(WCHAR) = (%d)\n", length,sizeof(WCHAR) );
        SetLastError(ERROR_ARITHMETIC_OVERFLOW);
        return NULL;
    }

    /* allocate required buffer */
    size_t fullsize = length * sizeof(WCHAR);
    lpWideCharStr = (LPWSTR)PAL_malloc(fullsize);
    if(NULL == lpWideCharStr)
    {
        ERROR("malloc() failed! errno is %d (%s)\n", errno,strerror(errno));
        SetLastError(FILEGetLastErrorFromErrno());
        return NULL;
    }

    /* convert into allocated buffer */
    length = MultiByteToWideChar(CP_ACP, 0, lpMultiByteStr, cbMultiByte, 
                                      lpWideCharStr, length);
    if(0 >= length)
    {
        ASSERT("MCToMB error; GetLastError returns %#x\n", GetLastError());
        PAL_free(lpWideCharStr);
        return NULL;
    }
    return lpWideCharStr;
}